

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

base_block_t *
base_block_alloc(tsdn_t *tsdn,base_t *base,extent_hooks_t *extent_hooks,uint ind,pszind_t *pind_last
                ,size_t *extent_sn_next,size_t size,size_t alignment)

{
  uint uVar1;
  int8_t *piVar2;
  uint64_t *puVar3;
  witness_t **ppwVar4;
  size_t sVar5;
  uint uVar6;
  pszind_t pVar7;
  base_block_t *b;
  base_block_t *addr;
  base_block_t *pbVar8;
  tsd_t *tsd;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  base_t *pbVar14;
  char *in_FS_OFFSET;
  _Bool local_52;
  _Bool zero;
  base_t *local_50;
  pszind_t *local_48;
  pthread_mutex_t *local_40;
  tsdn_t *local_38;
  
  uVar11 = alignment + 0xf & 0xfffffffffffffff0;
  uVar11 = (uVar11 + 0x8f & -uVar11) + ((size + uVar11) - 1 & -uVar11);
  if (uVar11 < 0x7000000000000001) {
    uVar13 = uVar11 * 2 - 1;
    lVar10 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    uVar13 = 0xfff;
    if (0xe < (uint)lVar10) {
      uVar13 = ~(-1L << ((char)lVar10 - 3U & 0x3f));
    }
    uVar11 = (~uVar13 & uVar11 + uVar13) + 0x1fffff;
  }
  else {
    uVar11 = 0x7000000000200fff;
  }
  for (lVar10 = 0x3f; 0xdfffffffffffffffU >> lVar10 == 0; lVar10 = lVar10 + -1) {
  }
  uVar6 = (uint)lVar10;
  iVar12 = uVar6 - 0xe;
  if (uVar6 < 0xe) {
    iVar12 = 0;
  }
  uVar1 = *pind_last + 1;
  bVar9 = (char)lVar10 - 3;
  if (uVar6 < 0xf) {
    bVar9 = 0xc;
  }
  uVar6 = *pind_last;
  if (uVar1 < ((uint)(((0x6fffffffffffffffU >> (bVar9 & 0x3f)) << (bVar9 & 0x3f)) >> (bVar9 & 0x3f))
              & 3) + iVar12 * 4) {
    uVar6 = uVar1;
  }
  uVar13 = sz_pind2sz_tab[uVar6] + 0x1fffff;
  if (sz_pind2sz_tab[uVar6] + 0x1fffff < uVar11) {
    uVar13 = uVar11;
  }
  uVar13 = uVar13 & 0xffffffffffe00000;
  zero = true;
  local_52 = true;
  local_50 = base;
  local_38 = tsdn;
  if (extent_hooks == &extent_hooks_default) {
    addr = (base_block_t *)extent_alloc_mmap((void *)0x0,uVar13,0x200000,&zero,&local_52);
  }
  else {
    tsd = &tsdn->tsd;
    local_48 = pind_last;
    if ((tsdn == (tsdn_t *)0x0) && (tsd = *(tsd_t **)in_FS_OFFSET, *in_FS_OFFSET != '\0')) {
      tsd = tsd_fetch_slow(tsd,false);
    }
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
         tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
    if ((tsd->state).repr == '\0') {
      tsd_slow_update(tsd);
    }
    addr = (base_block_t *)
           (*extent_hooks->alloc)(extent_hooks,(void *)0x0,uVar13,0x200000,&zero,&local_52,ind);
    piVar2 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    *piVar2 = *piVar2 + -1;
    pind_last = local_48;
    if (*piVar2 == '\0') {
      tsd_slow_update(tsd);
      pind_last = local_48;
    }
  }
  pbVar14 = local_50;
  if (addr == (base_block_t *)0x0) {
    addr = (base_block_t *)0x0;
  }
  else {
    if ((opt_metadata_thp != metadata_thp_disabled) && (init_system_thp_mode == thp_mode_default)) {
      if (opt_metadata_thp == metadata_thp_always) {
        pages_huge(addr,uVar13);
      }
      else if (local_50 != (base_t *)0x0 && opt_metadata_thp == metadata_thp_auto) {
        local_40 = (pthread_mutex_t *)((long)&(local_50->mtx).field_0 + 0x40);
        iVar12 = pthread_mutex_trylock(local_40);
        if (iVar12 != 0) {
          malloc_mutex_lock_slow(&pbVar14->mtx);
          (local_50->mtx).field_0.field_0.locked.repr = true;
          pbVar14 = local_50;
        }
        puVar3 = &(pbVar14->mtx).field_0.field_0.prof_data.n_lock_ops;
        *puVar3 = *puVar3 + 1;
        if ((pbVar14->mtx).field_0.field_0.prof_data.prev_owner != local_38) {
          (pbVar14->mtx).field_0.field_0.prof_data.prev_owner = local_38;
          ppwVar4 = &(pbVar14->mtx).field_0.witness.link.qre_prev;
          *ppwVar4 = (witness_t *)((long)&(*ppwVar4)->name + 1);
        }
        local_48 = pind_last;
        if (pbVar14->auto_thp_switched == false) {
          pbVar8 = pbVar14->blocks;
          if (pbVar14->ind == 0) {
            lVar10 = 4;
            do {
              pbVar8 = pbVar8->next;
              lVar10 = lVar10 + -1;
            } while (pbVar8 != (base_block_t *)0x0);
          }
          else {
            lVar10 = 1;
            do {
              pbVar8 = pbVar8->next;
              lVar10 = lVar10 + -1;
            } while (pbVar8 != (base_block_t *)0x0);
          }
          pbVar14 = local_50;
          if (lVar10 == 0) {
            local_50->auto_thp_switched = true;
            for (pbVar8 = local_50->blocks; pbVar8 != (base_block_t *)0x0; pbVar8 = pbVar8->next) {
              pages_huge(pbVar8,pbVar8->size);
              local_50->n_thp =
                   local_50->n_thp +
                   ((pbVar8->size - (pbVar8->extent).field_2.e_size_esn) + 0x1fffff >> 0x15);
            }
          }
        }
        if (pbVar14->auto_thp_switched == true) {
          pages_huge(addr,uVar13);
          pbVar14 = local_50;
        }
        (pbVar14->mtx).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(local_40);
        pind_last = local_48;
      }
    }
    if (uVar13 < 0x7000000000000001) {
      uVar11 = uVar13 * 2 - 1;
      lVar10 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      uVar6 = (uint)lVar10;
      iVar12 = uVar6 - 0xe;
      if (uVar6 < 0xe) {
        iVar12 = 0;
      }
      bVar9 = (char)lVar10 - 3;
      if (uVar6 < 0xf) {
        bVar9 = 0xc;
      }
      pVar7 = ((uint)(((uVar13 - 1 >> (bVar9 & 0x3f)) << (bVar9 & 0x3f)) >> (bVar9 & 0x3f)) & 3) +
              iVar12 * 4;
    }
    else {
      pVar7 = 199;
    }
    *pind_last = pVar7;
    addr->size = uVar13;
    addr->next = (base_block_t *)0x0;
    sVar5 = *extent_sn_next;
    *extent_sn_next = sVar5 + 1;
    (addr->extent).e_addr = addr + 1;
    (addr->extent).field_2.e_size_esn = uVar13 - 0x90;
    (addr->extent).e_bits =
         ((addr->extent).e_bits & 0x3fffc000fff | 0xfff) + (sVar5 << 0x2a) + 0x3a0e000;
  }
  return addr;
}

Assistant:

static base_block_t *
base_block_alloc(tsdn_t *tsdn, base_t *base, extent_hooks_t *extent_hooks,
    unsigned ind, pszind_t *pind_last, size_t *extent_sn_next, size_t size,
    size_t alignment) {
	alignment = ALIGNMENT_CEILING(alignment, QUANTUM);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t header_size = sizeof(base_block_t);
	size_t gap_size = ALIGNMENT_CEILING(header_size, alignment) -
	    header_size;
	/*
	 * Create increasingly larger blocks in order to limit the total number
	 * of disjoint virtual memory ranges.  Choose the next size in the page
	 * size class series (skipping size classes that are not a multiple of
	 * HUGEPAGE), or a size large enough to satisfy the requested size and
	 * alignment, whichever is larger.
	 */
	size_t min_block_size = HUGEPAGE_CEILING(sz_psz2u(header_size + gap_size
	    + usize));
	pszind_t pind_next = (*pind_last + 1 < sz_psz2ind(SC_LARGE_MAXCLASS)) ?
	    *pind_last + 1 : *pind_last;
	size_t next_block_size = HUGEPAGE_CEILING(sz_pind2sz(pind_next));
	size_t block_size = (min_block_size > next_block_size) ? min_block_size
	    : next_block_size;
	base_block_t *block = (base_block_t *)base_map(tsdn, extent_hooks, ind,
	    block_size);
	if (block == NULL) {
		return NULL;
	}

	if (metadata_thp_madvise()) {
		void *addr = (void *)block;
		assert(((uintptr_t)addr & HUGEPAGE_MASK) == 0 &&
		    (block_size & HUGEPAGE_MASK) == 0);
		if (opt_metadata_thp == metadata_thp_always) {
			pages_huge(addr, block_size);
		} else if (opt_metadata_thp == metadata_thp_auto &&
		    base != NULL) {
			/* base != NULL indicates this is not a new base. */
			malloc_mutex_lock(tsdn, &base->mtx);
			base_auto_thp_switch(tsdn, base);
			if (base->auto_thp_switched) {
				pages_huge(addr, block_size);
			}
			malloc_mutex_unlock(tsdn, &base->mtx);
		}
	}

	*pind_last = sz_psz2ind(block_size);
	block->size = block_size;
	block->next = NULL;
	assert(block_size >= header_size);
	base_extent_init(extent_sn_next, &block->extent,
	    (void *)((uintptr_t)block + header_size), block_size - header_size);
	return block;
}